

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEBody.cpp
# Opt level: O1

void __thiscall CEBody::CEBody(CEBody *this,CESkyCoord *coords,string *name)

{
  CESkyCoord::CESkyCoord(&this->super_CESkyCoord,coords);
  (this->super_CESkyCoord)._vptr_CESkyCoord = (_func_int **)&PTR__CEBody_0012e628;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace((ulong)&this->name_,0,(char *)0x0,0x12436a);
  if (name->_M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this->name_);
  }
  return;
}

Assistant:

CEBody::CEBody(const CESkyCoord&  coords, 
               const std::string& name) :
    CESkyCoord(coords)
{
    init_members();
    
    // Set the name if it is not empty
    if (name.size() > 0) SetName(name);
}